

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::Clear(Solver *this)

{
  Model *this_00;
  pointer ppRVar1;
  pointer ppRVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  local_54.severity_ = INFO;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_30,"Clear",&local_56);
  poVar3 = Logger::Start(INFO,&local_50,0x270,&local_30);
  std::operator<<(poVar3,"Clear the xLearn environment ...");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_54);
  std::__cxx11::string::string
            ((string *)&local_50,"Clear the xLearn environment ...",(allocator *)&local_30);
  Color::print_action(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = this->model_;
  if (this_00 != (Model *)0x0) {
    Model::~Model(this_00);
  }
  operator_delete(this_00);
  uVar4 = 0;
  while( true ) {
    ppRVar1 = (this->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppRVar2 = (this->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)ppRVar1 - (long)ppRVar2 >> 3) <= uVar4) break;
    if (ppRVar2[uVar4] != (Reader *)0x0) {
      (*ppRVar2[uVar4]->_vptr_Reader[1])();
    }
    uVar4 = uVar4 + 1;
  }
  if (ppRVar1 != ppRVar2) {
    (this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar2;
  }
  return;
}

Assistant:

void Solver::Clear() {
  LOG(INFO) << "Clear the xLearn environment ...";
  Color::print_action("Clear the xLearn environment ...");
  // Clear model
  delete this->model_;
  // Clear Reader
  for (size_t i = 0; i < this->reader_.size(); ++i) {
    if (reader_[i] != nullptr) {
      delete reader_[i];
    }
  }
  reader_.clear();
}